

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall
spvtools::val::Function::IsBlockType(Function *this,uint32_t merge_block_id,BlockType type)

{
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar1;
  tuple<spvtools::val::BasicBlock_const*&,std::_Swallow_assign_const&> local_58 [16];
  BasicBlock *local_48;
  undefined1 local_40;
  pair<const_spvtools::val::BasicBlock_*,_bool> local_38;
  BasicBlock *local_28;
  BasicBlock *block;
  BlockType local_18;
  uint32_t uStack_14;
  bool ret;
  BlockType type_local;
  uint32_t merge_block_id_local;
  Function *this_local;
  
  block._7_1_ = 0;
  local_18 = type;
  uStack_14 = merge_block_id;
  _type_local = this;
  pVar1 = GetBlock(this,merge_block_id);
  local_48 = pVar1.first;
  local_40 = pVar1.second;
  local_38.first = local_48;
  local_38.second = (bool)local_40;
  std::tie<spvtools::val::BasicBlock_const*,std::_Swallow_assign_const>
            ((BasicBlock **)local_58,(_Swallow_assign *)&local_28);
  std::tuple<spvtools::val::BasicBlock_const*&,std::_Swallow_assign_const&>::operator=
            (local_58,&local_38);
  if (local_28 != (BasicBlock *)0x0) {
    block._7_1_ = BasicBlock::is_type(local_28,local_18);
  }
  return (bool)(block._7_1_ & 1);
}

Assistant:

bool Function::IsBlockType(uint32_t merge_block_id, BlockType type) const {
  bool ret = false;
  const BasicBlock* block;
  std::tie(block, std::ignore) = GetBlock(merge_block_id);
  if (block) {
    ret = block->is_type(type);
  }
  return ret;
}